

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmArray(ExpressionContext *ctx,VmModule *module,ExprArray *node)

{
  uint uniqueId;
  TypeBase *type;
  SynBase *pSVar1;
  Allocator *allocator;
  bool bVar2;
  TypeArray *type_00;
  VmConstant *address_00;
  VmValue *pVVar3;
  VmConstant *arrayLength_00;
  VmConstant *elementSize_00;
  VmConstant *index_00;
  TypeRef *structType;
  VmValue *address_01;
  VmInstruction *this;
  VmType VVar4;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar5;
  VmInstruction *local_a0;
  VmValue *element_1;
  ExprBase *value_1;
  VmInstruction *inst;
  VmValue *address;
  VmValue *index;
  VmValue *elementSize;
  VmValue *arrayLength;
  VmValue *element;
  ExprBase *value;
  uint i;
  VmValue *storage;
  TypeBase *elementType;
  TypeArray *typeArray;
  ExprArray *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  bVar2 = isType<TypeArray>((node->super_ExprBase).type);
  if (!bVar2) {
    __assert_fail("isType<TypeArray>(node->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xa23,"VmValue *CompileVmArray(ExpressionContext &, VmModule *, ExprArray *)");
  }
  type_00 = getType<TypeArray>((node->super_ExprBase).type);
  type = type_00->subType;
  if (((type == ctx->typeBool) || (type == ctx->typeChar)) || (type == ctx->typeShort)) {
    address_00 = anon_unknown.dwarf_1a3010::CreateAlloca
                           (ctx,module,(node->super_ExprBase).source,&type_00->super_TypeBase,
                            "arr_lit",true);
    value._4_4_ = 0;
    for (element = (VmValue *)(node->values).head; element != (VmValue *)0x0;
        element = (VmValue *)element->source) {
      pVVar3 = CompileVm(ctx,module,(ExprBase *)element);
      arrayLength_00 =
           CreateConstantInt(module->allocator,(node->super_ExprBase).source,(int)type_00->length);
      elementSize_00 =
           CreateConstantInt(module->allocator,(node->super_ExprBase).source,(int)type->size);
      index_00 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,value._4_4_);
      pSVar1 = (node->super_ExprBase).source;
      structType = ExpressionContext::GetReferenceType(ctx,type);
      address_01 = anon_unknown.dwarf_1a3010::CreateIndex
                             (module,pSVar1,&arrayLength_00->super_VmValue,
                              &elementSize_00->super_VmValue,&address_00->super_VmValue,
                              &index_00->super_VmValue,&structType->super_TypeBase);
      anon_unknown.dwarf_1a3010::CreateStore
                (ctx,module,(node->super_ExprBase).source,type,address_01,pVVar3,0);
      value._4_4_ = value._4_4_ + 1;
    }
    pVVar3 = anon_unknown.dwarf_1a3010::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,&type_00->super_TypeBase,
                        &address_00->super_VmValue,0);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,pVVar3);
  }
  else {
    this = VmModule::get<VmInstruction>(module);
    allocator = module->allocator;
    VVar4 = GetVmType(ctx,(node->super_ExprBase).type);
    pSVar1 = (node->super_ExprBase).source;
    uniqueId = module->currentFunction->nextInstructionId;
    module->currentFunction->nextInstructionId = uniqueId + 1;
    pVVar3 = (VmValue *)CONCAT44(uVar5,uniqueId);
    VmInstruction::VmInstruction(this,allocator,VVar4,pSVar1,VM_INST_ARRAY,uniqueId);
    for (element_1 = (VmValue *)(node->values).head; element_1 != (VmValue *)0x0;
        element_1 = (VmValue *)element_1->source) {
      local_a0 = (VmInstruction *)CompileVm(ctx,module,(ExprBase *)element_1);
      if (type == ctx->typeFloat) {
        VVar4.structType = (TypeBase *)0x11;
        VVar4._0_8_ = VmType::Int.structType;
        local_a0 = anon_unknown.dwarf_1a3010::CreateInstruction
                             ((anon_unknown_dwarf_1a3010 *)module,
                              (VmModule *)(node->super_ExprBase).source,(SynBase *)VmType::Int._0_8_
                              ,VVar4,(VmInstructionType)local_a0,pVVar3);
      }
      VmInstruction::AddArgument(this,&local_a0->super_VmValue);
    }
    VmBlock::AddInstruction(module->currentBlock,this);
    ctx_local = (ExpressionContext *)
                anon_unknown.dwarf_1a3010::CheckType(ctx,&node->super_ExprBase,&this->super_VmValue)
    ;
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* CompileVmArray(ExpressionContext &ctx, VmModule *module, ExprArray *node)
{
	assert(isType<TypeArray>(node->type));

	TypeArray *typeArray = getType<TypeArray>(node->type);

	TypeBase *elementType = typeArray->subType;

	if(elementType == ctx.typeBool || elementType == ctx.typeChar || elementType == ctx.typeShort)
	{
		VmValue *storage = CreateAlloca(ctx, module, node->source, typeArray, "arr_lit", true);

		unsigned i = 0;

		for(ExprBase *value = node->values.head; value; value = value->next)
		{
			VmValue *element = CompileVm(ctx, module, value);

			VmValue *arrayLength = CreateConstantInt(module->allocator, node->source, unsigned(typeArray->length));
			VmValue *elementSize = CreateConstantInt(module->allocator, node->source, unsigned(elementType->size));
			VmValue *index = CreateConstantInt(module->allocator, node->source, i);

			VmValue *address = CreateIndex(module, node->source, arrayLength, elementSize, storage, index, ctx.GetReferenceType(elementType));

			CreateStore(ctx, module, node->source, elementType, address, element, 0);

			i++;
		}

		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, typeArray, storage, 0));
	}

	VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, GetVmType(ctx, node->type), node->source, VM_INST_ARRAY, module->currentFunction->nextInstructionId++);

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		VmValue *element = CompileVm(ctx, module, value);

		if(elementType == ctx.typeFloat)
			element = CreateInstruction(module, node->source, VmType::Int, VM_INST_DOUBLE_TO_FLOAT, element);

		inst->AddArgument(element);
	}

	module->currentBlock->AddInstruction(inst);

	return CheckType(ctx, node, inst);
}